

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int isSCnumber(expdesc *e,int *pi,int *isfloat)

{
  int iVar1;
  anon_union_8_6_45a55102_for_u local_30;
  lua_Integer i;
  int *isfloat_local;
  int *pi_local;
  expdesc *e_local;
  
  i = (lua_Integer)isfloat;
  isfloat_local = pi;
  pi_local = (int *)e;
  if (e->k == VKINT) {
    local_30 = e->u;
  }
  else {
    if (e->k != VKFLT) {
      return 0;
    }
    iVar1 = luaV_flttointeger((e->u).nval,&local_30.ival,F2Ieq);
    if (iVar1 == 0) {
      return 0;
    }
    *(undefined4 *)i = 1;
  }
  if ((pi_local[4] == pi_local[5]) && (iVar1 = fitsC(local_30.ival), iVar1 != 0)) {
    *isfloat_local = local_30.info + 0x7f;
    return 1;
  }
  return 0;
}

Assistant:

static int isSCnumber (expdesc *e, int *pi, int *isfloat) {
  lua_Integer i;
  if (e->k == VKINT)
    i = e->u.ival;
  else if (e->k == VKFLT && luaV_flttointeger(e->u.nval, &i, F2Ieq))
    *isfloat = 1;
  else
    return 0;  /* not a number */
  if (!hasjumps(e) && fitsC(i)) {
    *pi = int2sC(cast_int(i));
    return 1;
  }
  else
    return 0;
}